

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O2

void __thiscall BufferedFileWriter::BufferedFileWriter(BufferedFileWriter *this)

{
  (this->super_TerminatableThread).m_thread._M_id._M_thread = 0;
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedFileWriter_00249ff8;
  (this->m_lastErrorStr)._M_dataplus._M_p = (pointer)&(this->m_lastErrorStr).field_2;
  (this->m_lastErrorStr)._M_string_length = 0;
  (this->m_lastErrorStr).field_2._M_local_buf[0] = '\0';
  this->m_terminated = false;
  WaitableSafeQueue<WriterData>::WaitableSafeQueue(&this->m_writeQueue,200);
  this->m_lastErrorCode = 0;
  this->m_nothingToExecute = true;
  TerminatableThread::run(&this->super_TerminatableThread);
  return;
}

Assistant:

BufferedFileWriter::BufferedFileWriter() : m_terminated(false), m_writeQueue(WRITE_QUEUE_MAX_SIZE)
{
    m_lastErrorCode = 0;
    m_nothingToExecute = true;
    run(this);
}